

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::ExpressionConstraint::fromSyntax(ExpressionConstraintSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  Compilation *compilation;
  undefined4 extraout_var;
  ExpressionConstraint *pEVar3;
  ASTContext *in_RSI;
  long in_RDI;
  ConstraintExprVisitor visitor;
  ExpressionConstraint *result;
  Expression *expr;
  bool isSoft;
  Compilation *comp;
  ConstraintExprVisitor *in_stack_ffffffffffffff98;
  ASTContext *args;
  ASTContext *in_stack_ffffffffffffffb0;
  bitmask<slang::ast::ASTFlags> local_38;
  undefined8 local_30;
  byte local_21;
  Compilation *local_20;
  ASTContext *local_18;
  long local_10;
  ExpressionConstraint *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x87b908);
  local_21 = *(short *)(local_10 + 0x18) == 0x118;
  compilation = (Compilation *)
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x87b92f);
  args = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,None);
  iVar2 = Expression::bind((int)compilation,(sockaddr *)args,(socklen_t)local_38.m_bits);
  local_30 = CONCAT44(extraout_var,iVar2);
  pEVar3 = BumpAllocator::
           emplace<slang::ast::ExpressionConstraint,slang::ast::Expression_const&,bool&>
                     ((BumpAllocator *)in_stack_ffffffffffffffb0,(Expression *)args,
                      (bool *)compilation);
  bVar1 = Expression::bad((Expression *)compilation);
  if (bVar1) {
    local_8 = (ExpressionConstraint *)
              Constraint::badConstraint(compilation,(Constraint *)in_stack_ffffffffffffff98);
  }
  else {
    ConstraintExprVisitor::ConstraintExprVisitor
              ((ConstraintExprVisitor *)&stack0xffffffffffffffb0,local_18,(bool)(local_21 & 1));
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>
                      ((Expression *)compilation,in_stack_ffffffffffffff98);
    local_8 = pEVar3;
    if (!bVar1) {
      local_8 = (ExpressionConstraint *)
                Constraint::badConstraint(compilation,(Constraint *)in_stack_ffffffffffffff98);
    }
  }
  return &local_8->super_Constraint;
}

Assistant:

Constraint& ExpressionConstraint::fromSyntax(const ExpressionConstraintSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    bool isSoft = syntax.soft.kind == TokenKind::SoftKeyword;
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = comp.emplace<ExpressionConstraint>(expr, isSoft);
    if (expr.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, isSoft);
    if (!expr.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}